

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lfunc.c
# Opt level: O1

UpVal * luaF_findupval(lua_State *L,StkId level)

{
  UpVal *pUVar1;
  UpVal *pUVar2;
  StkId pSVar3;
  anon_union_16_2_5131162a_for_u *paVar4;
  
  paVar4 = (anon_union_16_2_5131162a_for_u *)&L->openupval;
  pUVar1 = L->openupval;
  if ((pUVar1 != (UpVal *)0x0) && (pSVar3 = (StkId)(pUVar1->v).p, level <= pSVar3)) {
    do {
      pUVar2 = pUVar1;
      if (pSVar3 == level) {
        return pUVar2;
      }
      pUVar1 = (pUVar2->u).open.next;
    } while ((pUVar1 != (UpVal *)0x0) && (pSVar3 = (StkId)(pUVar1->v).p, level <= pSVar3));
    paVar4 = &pUVar2->u;
  }
  pUVar2 = (UpVal *)luaC_newobj(L,9,0x28);
  pUVar1 = (paVar4->open).next;
  (pUVar2->v).p = (TValue *)level;
  (pUVar2->u).open.next = pUVar1;
  *(anon_union_16_2_5131162a_for_u **)((long)&pUVar2->u + 8) = paVar4;
  if (pUVar1 != (UpVal *)0x0) {
    (pUVar1->u).open.previous = (UpVal **)&pUVar2->u;
  }
  (paVar4->open).next = pUVar2;
  if (L->twups == L) {
    L->twups = L->l_G->twups;
    L->l_G->twups = L;
  }
  return pUVar2;
}

Assistant:

UpVal *luaF_findupval (lua_State *L, StkId level) {
  UpVal **pp = &L->openupval;
  UpVal *p;
  lua_assert(isintwups(L) || L->openupval == NULL);
  while ((p = *pp) != NULL && uplevel(p) >= level) {  /* search for it */
    lua_assert(!isdead(G(L), p));
    if (uplevel(p) == level)  /* corresponding upvalue? */
      return p;  /* return it */
    pp = &p->u.open.next;
  }
  /* not found: create a new upvalue after 'pp' */
  return newupval(L, level, pp);
}